

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O1

bool __thiscall OpenMesh::IO::_PLYReader_::can_u_read(_PLYReader_ *this,istream *_is)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  mostream *pmVar7;
  ostream *poVar8;
  mapped_type *pmVar9;
  long lVar10;
  char *pcVar11;
  map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
  *this_00;
  undefined8 uVar12;
  char *pcVar13;
  pointer pcVar14;
  bool bVar15;
  string local_238;
  string local_218;
  size_type *psStack_1f0;
  float version;
  string listIndexType;
  string listEntryType;
  undefined1 local_1a0 [16];
  string local_190;
  uint *local_170;
  uint *local_168;
  size_type *local_160;
  string keyword;
  string elementName;
  string propertyName;
  string fileType;
  string tmp2;
  string line;
  string tmp1;
  undefined1 local_70 [8];
  VertexPropertyInfo entry;
  uint local_34;
  
  (this->options_).flags_ = 0;
  this_00 = &this->vertexPropertyMap_;
  std::
  _Rb_tree<int,_std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>,_std::_Select1st<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
  ::clear(&this_00->_M_t);
  this->vertexPropertyCount_ = 0;
  tmp2.field_2._8_8_ = &line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)_is + -0x18) + (char)_is);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            (_is,(string *)(tmp2.field_2._M_local_buf + 8),cVar4);
  uVar2 = tmp2.field_2._8_8_;
  uVar12 = line._M_dataplus._M_p + tmp2.field_2._8_8_;
  pcVar14 = (pointer)uVar12;
  tmp1.field_2._8_8_ = _is;
  if (0 < (long)line._M_dataplus._M_p >> 2) {
    pcVar14 = (pointer)((ulong)((uint)line._M_dataplus._M_p & 3) + tmp2.field_2._8_8_);
    lVar10 = ((long)line._M_dataplus._M_p >> 2) + 1;
    do {
      iVar5 = isspace((int)*(char *)(uVar12 + -1));
      if (iVar5 == 0) goto LAB_0017b794;
      iVar5 = isspace((int)*(char *)(uVar12 + -2));
      if (iVar5 == 0) {
        uVar12 = uVar12 + -1;
        goto LAB_0017b794;
      }
      iVar5 = isspace((int)*(char *)(uVar12 + -3));
      if (iVar5 == 0) {
        uVar12 = uVar12 + -2;
        goto LAB_0017b794;
      }
      iVar5 = isspace((int)*(char *)(uVar12 + -4));
      if (iVar5 == 0) {
        uVar12 = uVar12 + -3;
        goto LAB_0017b794;
      }
      uVar12 = uVar12 + -4;
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
  }
  lVar10 = (long)pcVar14 - uVar2;
  if (lVar10 == 1) {
LAB_0017b76b:
    iVar5 = isspace((int)pcVar14[-1]);
    uVar12 = pcVar14;
    if (iVar5 != 0) {
      uVar12 = uVar2;
    }
  }
  else {
    uVar12 = pcVar14;
    if (lVar10 == 2) {
LAB_0017b759:
      iVar5 = isspace((int)*(char *)(uVar12 + -1));
      if (iVar5 != 0) {
        pcVar14 = (pointer)(uVar12 + -1);
        goto LAB_0017b76b;
      }
    }
    else {
      uVar12 = uVar2;
      if ((lVar10 == 3) && (iVar5 = isspace((int)pcVar14[-1]), uVar12 = pcVar14, iVar5 != 0)) {
        uVar12 = pcVar14 + -1;
        goto LAB_0017b759;
      }
    }
  }
LAB_0017b794:
  uVar3 = tmp2.field_2._8_8_;
  line._M_dataplus._M_p = (pointer)(uVar12 + -uVar2);
  *(char *)uVar12 = '\0';
  pcVar11 = line._M_dataplus._M_p + tmp2.field_2._8_8_;
  uVar12 = tmp2.field_2._8_8_;
  if (0 < (long)line._M_dataplus._M_p >> 2) {
    uVar12 = ((ulong)line._M_dataplus._M_p & 0xfffffffffffffffc) + tmp2.field_2._8_8_;
    lVar10 = ((long)line._M_dataplus._M_p >> 2) + 1;
    pcVar13 = (char *)(tmp2.field_2._8_8_ + 3);
    do {
      iVar5 = isspace((int)pcVar13[-3]);
      if (iVar5 == 0) {
        pcVar13 = pcVar13 + -3;
        goto LAB_0017b880;
      }
      iVar5 = isspace((int)pcVar13[-2]);
      if (iVar5 == 0) {
        pcVar13 = pcVar13 + -2;
        goto LAB_0017b880;
      }
      iVar5 = isspace((int)pcVar13[-1]);
      if (iVar5 == 0) {
        pcVar13 = pcVar13 + -1;
        goto LAB_0017b880;
      }
      iVar5 = isspace((int)*pcVar13);
      if (iVar5 == 0) goto LAB_0017b880;
      lVar10 = lVar10 + -1;
      pcVar13 = pcVar13 + 4;
    } while (1 < lVar10);
  }
  lVar10 = (long)pcVar11 - uVar12;
  if (lVar10 == 1) {
LAB_0017b85d:
    iVar5 = isspace((int)*(char *)uVar12);
    pcVar13 = (char *)uVar12;
    if (iVar5 != 0) {
      pcVar13 = pcVar11;
    }
  }
  else if (lVar10 == 2) {
LAB_0017b84d:
    iVar5 = isspace((int)*(char *)uVar12);
    pcVar13 = (char *)uVar12;
    if (iVar5 != 0) {
      uVar12 = uVar12 + 1;
      goto LAB_0017b85d;
    }
  }
  else {
    pcVar13 = pcVar11;
    if ((lVar10 == 3) &&
       (iVar5 = isspace((int)*(char *)uVar12), pcVar13 = (char *)uVar12, iVar5 != 0)) {
      uVar12 = uVar12 + 1;
      goto LAB_0017b84d;
    }
  }
LAB_0017b880:
  if (pcVar11 == pcVar13) {
    line._M_dataplus._M_p = (pointer)0x0;
    *(undefined1 *)uVar3 = 0;
  }
  else {
    std::__cxx11::string::_M_erase((ulong)((long)&tmp2.field_2 + 8),0);
  }
  uVar12 = tmp1.field_2._8_8_;
  iVar5 = std::__cxx11::string::compare(tmp2.field_2._M_local_buf + 8);
  if ((iVar5 != 0) &&
     (iVar5 = std::__cxx11::string::compare(tmp2.field_2._M_local_buf + 8), iVar5 != 0)) {
    bVar15 = false;
    goto LAB_0017bb18;
  }
  this->vertexCount_ = 0;
  this->faceCount_ = 0;
  this->vertexDimension_ = 0;
  keyword._M_dataplus._M_p = (pointer)0x0;
  keyword._M_string_length._0_1_ = 0;
  propertyName.field_2._8_8_ = &fileType._M_string_length;
  fileType._M_dataplus._M_p = (pointer)0x0;
  fileType._M_string_length._0_1_ = 0;
  keyword.field_2._8_8_ = &elementName._M_string_length;
  local_160 = &keyword._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&keyword.field_2 + 8),"");
  elementName.field_2._8_8_ = &propertyName._M_string_length;
  propertyName._M_dataplus._M_p = (pointer)0x0;
  propertyName._M_string_length._0_1_ = 0;
  psStack_1f0 = &listIndexType._M_string_length;
  listIndexType._M_dataplus._M_p = (pointer)0x0;
  listIndexType._M_string_length._0_1_ = 0;
  listIndexType.field_2._8_8_ = &listEntryType._M_string_length;
  listEntryType._M_dataplus._M_p = (pointer)0x0;
  listEntryType._M_string_length._0_1_ = 0;
  std::operator>>((istream *)uVar12,(string *)&local_160);
  std::operator>>((istream *)uVar12,(string *)(propertyName.field_2._M_local_buf + 8));
  std::istream::_M_extract<float>((float *)uVar12);
  if ((*(byte *)(uVar12 + 0x20 + *(long *)(*(long *)uVar12 + -0x18)) & 1) == 0) {
    iVar5 = std::__cxx11::string::compare(propertyName.field_2._M_local_buf + 8);
    if (iVar5 == 0) {
      uVar6 = (this->options_).flags_ & 0xfffffffe;
    }
    else {
      iVar5 = std::__cxx11::string::compare(propertyName.field_2._M_local_buf + 8);
      if (iVar5 == 0) {
        uVar6 = (this->options_).flags_ | 5;
      }
      else {
        iVar5 = std::__cxx11::string::compare(propertyName.field_2._M_local_buf + 8);
        if (iVar5 != 0) {
          pmVar7 = omerr();
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pmVar7->super_ostream,"Unsupported PLY format: ",0x18);
          pmVar7 = (mostream *)
                   std::__ostream_insert<char,std::char_traits<char>>
                             (&pmVar7->super_ostream,(char *)propertyName.field_2._8_8_,
                              (long)fileType._M_dataplus._M_p);
          std::ios::widen((char)(pmVar7->super_ostream)._vptr_basic_ostream[-3] + (char)pmVar7);
          goto LAB_0017ba80;
        }
        uVar6 = (this->options_).flags_ | 3;
      }
    }
    (this->options_).flags_ = uVar6;
    lVar10 = std::istream::tellg();
    std::operator>>((istream *)uVar12,(string *)&local_160);
    iVar5 = std::__cxx11::string::compare((char *)&local_160);
    bVar15 = iVar5 == 0;
    if (!bVar15) {
      local_170 = &this->vertexCount_;
      local_168 = &this->faceCount_;
      do {
        iVar5 = std::__cxx11::string::compare((char *)&local_160);
        if (iVar5 == 0) {
          cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)tmp1.field_2._8_8_ + -0x18) +
                                  (char)tmp1.field_2._8_8_);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)tmp1.field_2._8_8_,(string *)(tmp2.field_2._M_local_buf + 8),cVar4);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_160);
          if (iVar5 == 0) {
            std::operator>>((istream *)tmp1.field_2._8_8_,
                            (string *)(keyword.field_2._M_local_buf + 8));
            iVar5 = std::__cxx11::string::compare(keyword.field_2._M_local_buf + 8);
            if ((iVar5 != 0) &&
               (iVar5 = std::__cxx11::string::compare(keyword.field_2._M_local_buf + 8), iVar5 != 0)
               ) {
              pmVar7 = omerr();
              std::__ostream_insert<char,std::char_traits<char>>
                        (&pmVar7->super_ostream,"PLY header unsupported element type: ",0x25);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (&pmVar7->super_ostream,(char *)keyword.field_2._8_8_,
                                  (long)elementName._M_dataplus._M_p);
              std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
              goto LAB_0017bd1b;
            }
            std::istream::_M_extract<unsigned_int>((uint *)tmp1.field_2._8_8_);
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)&local_160);
            if (iVar5 == 0) {
              line.field_2._8_8_ = &tmp1._M_string_length;
              tmp1._M_dataplus._M_p = (pointer)0x0;
              tmp1._M_string_length._0_1_ = 0;
              fileType.field_2._8_8_ = &tmp2._M_string_length;
              tmp2._M_dataplus._M_p = (pointer)0x0;
              tmp2._M_string_length._0_1_ = 0;
              std::operator>>((istream *)tmp1.field_2._8_8_,
                              (string *)(line.field_2._M_local_buf + 8));
              iVar5 = std::__cxx11::string::compare(line.field_2._M_local_buf + 8);
              if (iVar5 == 0) {
                iVar5 = std::__cxx11::string::compare(keyword.field_2._M_local_buf + 8);
                if (iVar5 == 0) {
                  pmVar7 = omerr();
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&pmVar7->super_ostream,"List type not supported for vertices!",0x25);
                  std::ios::widen((char)(pmVar7->super_ostream)._vptr_basic_ostream[-3] +
                                  (char)pmVar7);
LAB_0017c260:
                  std::ostream::put((char)pmVar7);
                  std::ostream::flush();
                  goto LAB_0017c38c;
                }
                iVar5 = std::__cxx11::string::compare(keyword.field_2._M_local_buf + 8);
                if (iVar5 != 0) goto LAB_0017c38c;
                std::operator>>((istream *)tmp1.field_2._8_8_,(string *)&stack0xfffffffffffffe10);
                std::operator>>((istream *)tmp1.field_2._8_8_,
                                (string *)(listIndexType.field_2._M_local_buf + 8));
                std::operator>>((istream *)tmp1.field_2._8_8_,
                                (string *)(elementName.field_2._M_local_buf + 8));
                pcVar11 = (char *)&stack0xfffffffffffffe10;
                iVar5 = std::__cxx11::string::compare(pcVar11);
                if (iVar5 != 0) {
                  iVar5 = std::__cxx11::string::compare(pcVar11);
                  if (iVar5 == 0) {
                    this->faceIndexType_ = ValueTypeUCHAR;
                    goto LAB_0017c417;
                  }
                  pmVar7 = omerr();
                  std::__ostream_insert<char,std::char_traits<char>>
                            (&pmVar7->super_ostream,"Unsupported Index type for face list: ",0x26);
LAB_0017c9a8:
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     (&pmVar7->super_ostream,*(char **)pcVar11,
                                      *(long *)(pcVar11 + 8));
                  std::endl<char,std::char_traits<char>>(poVar8);
                  if ((size_type *)fileType.field_2._8_8_ != &tmp2._M_string_length) {
                    operator_delete((void *)fileType.field_2._8_8_);
                  }
                  if ((size_type *)line.field_2._8_8_ != &tmp1._M_string_length) {
                    operator_delete((void *)line.field_2._8_8_);
                  }
                  goto LAB_0017ba96;
                }
                this->faceIndexType_ = ValueTypeUINT8;
LAB_0017c417:
                pcVar11 = listIndexType.field_2._M_local_buf + 8;
                iVar5 = std::__cxx11::string::compare(pcVar11);
                if (iVar5 == 0) {
                  this->faceEntryType_ = ValueTypeINT32;
                }
                else {
                  iVar5 = std::__cxx11::string::compare(pcVar11);
                  if (iVar5 == 0) {
                    this->faceEntryType_ = ValueTypeINT;
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare(pcVar11);
                    if (iVar5 == 0) {
                      this->faceEntryType_ = ValueTypeUINT32;
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare(pcVar11);
                      if (iVar5 != 0) {
                        pmVar7 = omerr();
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (&pmVar7->super_ostream,"Unsupported Entry type for face list: ",
                                   0x26);
                        goto LAB_0017c9a8;
                      }
                      this->faceEntryType_ = ValueTypeUINT;
                    }
                  }
                }
              }
              else {
                std::operator>>((istream *)tmp1.field_2._8_8_,
                                (string *)(fileType.field_2._M_local_buf + 8));
                iVar5 = std::__cxx11::string::compare(keyword.field_2._M_local_buf + 8);
                if (iVar5 != 0) {
                  iVar5 = std::__cxx11::string::compare(keyword.field_2._M_local_buf + 8);
                  if (iVar5 == 0) {
                    pmVar7 = omerr();
                    std::__ostream_insert<char,std::char_traits<char>>
                              (&pmVar7->super_ostream,"Properties not supported for faces ",0x23);
                    std::ios::widen((char)(pmVar7->super_ostream)._vptr_basic_ostream[-3] +
                                    (char)pmVar7);
                    goto LAB_0017c260;
                  }
                  goto LAB_0017c38c;
                }
                listEntryType.field_2._8_8_ = local_1a0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)((long)&listEntryType.field_2 + 8),line.field_2._8_8_,
                           tmp1._M_dataplus._M_p + line.field_2._8_8_);
                local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_238,fileType.field_2._8_8_,
                           tmp2._M_dataplus._M_p + fileType.field_2._8_8_);
                entry.name.field_2._12_4_ =
                     get_property_type((string *)((long)&listEntryType.field_2 + 8),&local_238);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p != &local_238.field_2) {
                  operator_delete(local_238._M_dataplus._M_p);
                }
                if ((undefined1 *)listEntryType.field_2._8_8_ != local_1a0) {
                  operator_delete((void *)listEntryType.field_2._8_8_);
                }
                local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_190,line.field_2._8_8_,
                           tmp1._M_dataplus._M_p + line.field_2._8_8_);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_218,fileType.field_2._8_8_,
                           tmp2._M_dataplus._M_p + fileType.field_2._8_8_);
                get_property_name((string *)local_70,&local_190,&local_218);
                std::__cxx11::string::operator=
                          ((string *)(elementName.field_2._M_local_buf + 8),(string *)local_70);
                if ((string *)CONCAT44(local_70._4_4_,local_70._0_4_) != &entry.name) {
                  operator_delete((undefined1 *)CONCAT44(local_70._4_4_,local_70._0_4_));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_190._M_dataplus._M_p != &local_190.field_2) {
                  operator_delete(local_190._M_dataplus._M_p);
                }
                pcVar11 = elementName.field_2._M_local_buf + 8;
                iVar5 = std::__cxx11::string::compare(pcVar11);
                if (iVar5 == 0) {
                  local_70._0_4_ = 0;
                  local_70._4_4_ = entry.name.field_2._12_4_;
                  entry._0_8_ = &entry.name._M_string_length;
                  entry.name._M_dataplus._M_p = (pointer)0x0;
                  entry.name._M_string_length._0_1_ = 0;
                  local_34 = this->vertexPropertyCount_;
                  pmVar9 = std::
                           map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                           ::operator[](this_00,(key_type *)&local_34);
                  pmVar9->property = local_70._0_4_;
                  pmVar9->value = local_70._4_4_;
                  std::__cxx11::string::_M_assign((string *)&pmVar9->name);
LAB_0017c36c:
                  this->vertexDimension_ = this->vertexDimension_ + 1;
                }
                else {
                  iVar5 = std::__cxx11::string::compare(pcVar11);
                  if (iVar5 == 0) {
                    local_70._0_4_ = 1;
                    local_70._4_4_ = entry.name.field_2._12_4_;
                    entry._0_8_ = &entry.name._M_string_length;
                    entry.name._M_dataplus._M_p = (pointer)0x0;
                    entry.name._M_string_length._0_1_ = 0;
                    local_34 = this->vertexPropertyCount_;
                    pmVar9 = std::
                             map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                             ::operator[](this_00,(key_type *)&local_34);
                    pmVar9->property = local_70._0_4_;
                    pmVar9->value = local_70._4_4_;
                    std::__cxx11::string::_M_assign((string *)&pmVar9->name);
                    goto LAB_0017c36c;
                  }
                  iVar5 = std::__cxx11::string::compare(pcVar11);
                  if (iVar5 == 0) {
                    local_70._0_4_ = 2;
                    local_70._4_4_ = entry.name.field_2._12_4_;
                    entry._0_8_ = &entry.name._M_string_length;
                    entry.name._M_dataplus._M_p = (pointer)0x0;
                    entry.name._M_string_length._0_1_ = 0;
                    local_34 = this->vertexPropertyCount_;
                    pmVar9 = std::
                             map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                             ::operator[](this_00,(key_type *)&local_34);
                    pmVar9->property = local_70._0_4_;
                    pmVar9->value = local_70._4_4_;
                    std::__cxx11::string::_M_assign((string *)&pmVar9->name);
                    goto LAB_0017c36c;
                  }
                  iVar5 = std::__cxx11::string::compare(pcVar11);
                  if (iVar5 == 0) {
                    local_70._0_4_ = 9;
                    local_70._4_4_ = entry.name.field_2._12_4_;
                    entry._0_8_ = &entry.name._M_string_length;
                    entry.name._M_dataplus._M_p = (pointer)0x0;
                    entry.name._M_string_length._0_1_ = 0;
                    local_34 = this->vertexPropertyCount_;
                    pmVar9 = std::
                             map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                             ::operator[](this_00,(key_type *)&local_34);
                    pmVar9->property = local_70._0_4_;
                    pmVar9->value = local_70._4_4_;
                    std::__cxx11::string::_M_assign((string *)&pmVar9->name);
LAB_0017c601:
                    *(byte *)&(this->options_).flags_ = (byte)(this->options_).flags_ | 0x10;
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare(pcVar11);
                    if (iVar5 == 0) {
                      local_70._0_4_ = 10;
                      local_70._4_4_ = entry.name.field_2._12_4_;
                      entry._0_8_ = &entry.name._M_string_length;
                      entry.name._M_dataplus._M_p = (pointer)0x0;
                      entry.name._M_string_length._0_1_ = 0;
                      local_34 = this->vertexPropertyCount_;
                      pmVar9 = std::
                               map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                               ::operator[](this_00,(key_type *)&local_34);
                      pmVar9->property = local_70._0_4_;
                      pmVar9->value = local_70._4_4_;
                      std::__cxx11::string::_M_assign((string *)&pmVar9->name);
                      goto LAB_0017c601;
                    }
                    iVar5 = std::__cxx11::string::compare(pcVar11);
                    if (iVar5 == 0) {
                      local_70._0_4_ = 0xb;
                      local_70._4_4_ = entry.name.field_2._12_4_;
                      entry._0_8_ = &entry.name._M_string_length;
                      entry.name._M_dataplus._M_p = (pointer)0x0;
                      entry.name._M_string_length._0_1_ = 0;
                      local_34 = this->vertexPropertyCount_;
                      pmVar9 = std::
                               map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                               ::operator[](this_00,(key_type *)&local_34);
                      pmVar9->property = local_70._0_4_;
                      pmVar9->value = local_70._4_4_;
                      std::__cxx11::string::_M_assign((string *)&pmVar9->name);
                      goto LAB_0017c601;
                    }
                    iVar5 = std::__cxx11::string::compare(pcVar11);
                    if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare(pcVar11), iVar5 == 0)
                       ) {
                      local_70._0_4_ = 3;
                      local_70._4_4_ = entry.name.field_2._12_4_;
                      entry._0_8_ = &entry.name._M_string_length;
                      entry.name._M_dataplus._M_p = (pointer)0x0;
                      entry.name._M_string_length._0_1_ = 0;
                      local_34 = this->vertexPropertyCount_;
                      pmVar9 = std::
                               map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                               ::operator[](this_00,(key_type *)&local_34);
                      pmVar9->property = local_70._0_4_;
                      pmVar9->value = local_70._4_4_;
                      std::__cxx11::string::_M_assign((string *)&pmVar9->name);
LAB_0017c65d:
                      *(byte *)&(this->options_).flags_ = (byte)(this->options_).flags_ | 0x40;
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare(pcVar11);
                      if ((iVar5 == 0) ||
                         (iVar5 = std::__cxx11::string::compare(pcVar11), iVar5 == 0)) {
                        local_70._0_4_ = 4;
                        local_70._4_4_ = entry.name.field_2._12_4_;
                        entry._0_8_ = &entry.name._M_string_length;
                        entry.name._M_dataplus._M_p = (pointer)0x0;
                        entry.name._M_string_length._0_1_ = 0;
                        local_34 = this->vertexPropertyCount_;
                        pmVar9 = std::
                                 map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                 ::operator[](this_00,(key_type *)&local_34);
                        pmVar9->property = local_70._0_4_;
                        pmVar9->value = local_70._4_4_;
                        std::__cxx11::string::_M_assign((string *)&pmVar9->name);
                        goto LAB_0017c65d;
                      }
                      iVar5 = std::__cxx11::string::compare(pcVar11);
                      uVar1 = entry.name.field_2._12_4_;
                      if (iVar5 == 0) {
                        local_70._0_4_ = 5;
                        local_70._4_4_ = entry.name.field_2._12_4_;
                        entry._0_8_ = &entry.name._M_string_length;
                        entry.name._M_dataplus._M_p = (pointer)0x0;
                        entry.name._M_string_length._0_1_ = 0;
                        local_34 = this->vertexPropertyCount_;
                        pmVar9 = std::
                                 map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                 ::operator[](this_00,(key_type *)&local_34);
                        pmVar9->property = local_70._0_4_;
                        pmVar9->value = local_70._4_4_;
                        std::__cxx11::string::_M_assign((string *)&pmVar9->name);
LAB_0017c7ba:
                        uVar6 = (uint)(uVar1 - 0xd < 2) << 0xc | (this->options_).flags_ | 0x20;
LAB_0017c7ca:
                        (this->options_).flags_ = uVar6;
                      }
                      else {
                        iVar5 = std::__cxx11::string::compare(pcVar11);
                        uVar1 = entry.name.field_2._12_4_;
                        if (iVar5 == 0) {
                          local_70._0_4_ = 6;
                          local_70._4_4_ = entry.name.field_2._12_4_;
                          entry._0_8_ = &entry.name._M_string_length;
                          entry.name._M_dataplus._M_p = (pointer)0x0;
                          entry.name._M_string_length._0_1_ = 0;
                          local_34 = this->vertexPropertyCount_;
                          pmVar9 = std::
                                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                   ::operator[](this_00,(key_type *)&local_34);
                          pmVar9->property = local_70._0_4_;
                          pmVar9->value = local_70._4_4_;
                          std::__cxx11::string::_M_assign((string *)&pmVar9->name);
                          goto LAB_0017c7ba;
                        }
                        iVar5 = std::__cxx11::string::compare(pcVar11);
                        uVar1 = entry.name.field_2._12_4_;
                        if (iVar5 == 0) {
                          local_70._0_4_ = 7;
                          local_70._4_4_ = entry.name.field_2._12_4_;
                          entry._0_8_ = &entry.name._M_string_length;
                          entry.name._M_dataplus._M_p = (pointer)0x0;
                          entry.name._M_string_length._0_1_ = 0;
                          local_34 = this->vertexPropertyCount_;
                          pmVar9 = std::
                                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                   ::operator[](this_00,(key_type *)&local_34);
                          pmVar9->property = local_70._0_4_;
                          pmVar9->value = local_70._4_4_;
                          std::__cxx11::string::_M_assign((string *)&pmVar9->name);
                          goto LAB_0017c7ba;
                        }
                        iVar5 = std::__cxx11::string::compare(pcVar11);
                        uVar1 = entry.name.field_2._12_4_;
                        if (iVar5 == 0) {
                          local_70._0_4_ = 5;
                          local_70._4_4_ = entry.name.field_2._12_4_;
                          entry._0_8_ = &entry.name._M_string_length;
                          entry.name._M_dataplus._M_p = (pointer)0x0;
                          entry.name._M_string_length._0_1_ = 0;
                          local_34 = this->vertexPropertyCount_;
                          pmVar9 = std::
                                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                   ::operator[](this_00,(key_type *)&local_34);
                          pmVar9->property = local_70._0_4_;
                          pmVar9->value = local_70._4_4_;
                          std::__cxx11::string::_M_assign((string *)&pmVar9->name);
                          goto LAB_0017c7ba;
                        }
                        iVar5 = std::__cxx11::string::compare(pcVar11);
                        if (iVar5 == 0) {
                          local_70._0_4_ = 6;
                          local_70._4_4_ = entry.name.field_2._12_4_;
                          entry._0_8_ = &entry.name._M_string_length;
                          entry.name._M_dataplus._M_p = (pointer)0x0;
                          entry.name._M_string_length._0_1_ = 0;
                          local_34 = this->vertexPropertyCount_;
                          pmVar9 = std::
                                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                   ::operator[](this_00,(key_type *)&local_34);
                          pmVar9->property = local_70._0_4_;
                          pmVar9->value = local_70._4_4_;
                          std::__cxx11::string::_M_assign((string *)&pmVar9->name);
                          uVar1 = entry.name.field_2._12_4_;
                          goto LAB_0017c7ba;
                        }
                        iVar5 = std::__cxx11::string::compare(elementName.field_2._M_local_buf + 8);
                        if (iVar5 == 0) {
                          local_70._0_4_ = 7;
                          local_70._4_4_ = entry.name.field_2._12_4_;
                          entry._0_8_ = &entry.name._M_string_length;
                          entry.name._M_dataplus._M_p = (pointer)0x0;
                          entry.name._M_string_length._0_1_ = 0;
                          local_34 = this->vertexPropertyCount_;
                          pmVar9 = std::
                                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                   ::operator[](this_00,(key_type *)&local_34);
                          pmVar9->property = local_70._0_4_;
                          pmVar9->value = local_70._4_4_;
                          std::__cxx11::string::_M_assign((string *)&pmVar9->name);
                          uVar1 = entry.name.field_2._12_4_;
                          goto LAB_0017c7ba;
                        }
                        iVar5 = std::__cxx11::string::compare(elementName.field_2._M_local_buf + 8);
                        if (iVar5 == 0) {
                          local_70._0_4_ = 8;
                          local_70._4_4_ = entry.name.field_2._12_4_;
                          entry._0_8_ = &entry.name._M_string_length;
                          entry.name._M_dataplus._M_p = (pointer)0x0;
                          entry.name._M_string_length._0_1_ = 0;
                          local_34 = this->vertexPropertyCount_;
                          pmVar9 = std::
                                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                   ::operator[](this_00,(key_type *)&local_34);
                          pmVar9->property = local_70._0_4_;
                          pmVar9->value = local_70._4_4_;
                          std::__cxx11::string::_M_assign((string *)&pmVar9->name);
                          uVar6 = (uint)(entry.name.field_2._12_4_ - 0xd < 2) << 0xc |
                                  (this->options_).flags_ | 0x820;
                          goto LAB_0017c7ca;
                        }
                        uVar6 = (this->options_).flags_;
                        if ((uVar6 & 1) == 0) {
                          (this->options_).flags_ = uVar6 | 0x2000;
                        }
                        local_70._0_4_ = uVar6 & 1 | 0xc;
                        local_70._4_4_ = entry.name.field_2._12_4_;
                        entry._0_8_ = &entry.name._M_string_length;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&entry,elementName.field_2._8_8_,
                                   propertyName._M_dataplus._M_p + elementName.field_2._8_8_);
                        local_34 = this->vertexPropertyCount_;
                        pmVar9 = std::
                                 map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                 ::operator[](this_00,(key_type *)&local_34);
                        pmVar9->property = local_70._0_4_;
                        pmVar9->value = local_70._4_4_;
                        std::__cxx11::string::_M_assign((string *)&pmVar9->name);
                      }
                    }
                  }
                }
                if ((size_type *)entry._0_8_ != &entry.name._M_string_length) {
                  operator_delete((void *)entry._0_8_);
                }
                this->vertexPropertyCount_ = this->vertexPropertyCount_ + 1;
              }
LAB_0017c38c:
              if ((size_type *)fileType.field_2._8_8_ != &tmp2._M_string_length) {
                operator_delete((void *)fileType.field_2._8_8_);
              }
              if ((size_type *)line.field_2._8_8_ != &tmp1._M_string_length) {
                operator_delete((void *)line.field_2._8_8_);
              }
            }
            else {
              pmVar7 = omlog();
              std::__ostream_insert<char,std::char_traits<char>>
                        (&pmVar7->super_ostream,"Unsupported keyword : ",0x16);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (&pmVar7->super_ostream,(char *)local_160,
                                  (long)keyword._M_dataplus._M_p);
              std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
LAB_0017bd1b:
              std::ostream::put((char)poVar8);
              std::ostream::flush();
            }
          }
        }
        uVar12 = tmp1.field_2._8_8_;
        lVar10 = std::istream::tellg();
        std::operator>>((istream *)uVar12,(string *)&local_160);
        if ((*(byte *)(tmp1.field_2._8_8_ + 0x20 + *(long *)(*(long *)tmp1.field_2._8_8_ + -0x18)) &
            1) != 0) {
          pmVar7 = omerr();
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pmVar7->super_ostream,"Error while reading PLY file header",0x23);
          std::ios::widen((char)(pmVar7->super_ostream)._vptr_basic_ostream[-3] + (char)pmVar7);
          std::ostream::put((char)pmVar7);
          std::ostream::flush();
          goto LAB_0017ba96;
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_160);
        bVar15 = iVar5 == 0;
      } while (!bVar15);
    }
    if (((this->options_).flags_ & 1) != 0) {
      std::istream::seekg(tmp1.field_2._8_8_,lVar10 + 0xc,0);
    }
  }
  else {
    pmVar7 = omerr();
    std::__ostream_insert<char,std::char_traits<char>>
              (&pmVar7->super_ostream,"Defect PLY header detected",0x1a);
    std::ios::widen((char)(pmVar7->super_ostream)._vptr_basic_ostream[-3] + (char)pmVar7);
LAB_0017ba80:
    std::ostream::put((char)pmVar7);
    std::ostream::flush();
    bVar15 = false;
  }
LAB_0017ba96:
  if ((size_type *)listIndexType.field_2._8_8_ != &listEntryType._M_string_length) {
    operator_delete((void *)listIndexType.field_2._8_8_);
  }
  if (psStack_1f0 != &listIndexType._M_string_length) {
    operator_delete(psStack_1f0);
  }
  if ((size_type *)elementName.field_2._8_8_ != &propertyName._M_string_length) {
    operator_delete((void *)elementName.field_2._8_8_);
  }
  if ((size_type *)keyword.field_2._8_8_ != &elementName._M_string_length) {
    operator_delete((void *)keyword.field_2._8_8_);
  }
  if ((size_type *)propertyName.field_2._8_8_ != &fileType._M_string_length) {
    operator_delete((void *)propertyName.field_2._8_8_);
  }
  if (local_160 != &keyword._M_string_length) {
    operator_delete(local_160);
  }
LAB_0017bb18:
  if ((size_type *)tmp2.field_2._8_8_ != &line._M_string_length) {
    operator_delete((void *)tmp2.field_2._8_8_);
  }
  return bVar15;
}

Assistant:

bool _PLYReader_::can_u_read(std::istream& _is) const {

    // Clear per file options
    options_.cleanup();

    // clear vertex property map, will be recreated
    vertexPropertyMap_.clear();
    vertexPropertyCount_ = 0;

    // read 1st line
    std::string line;
    std::getline(_is, line);
    trim(line);

    //Check if this file is really a ply format
    if (line != "PLY" && line != "ply")
        return false;

    vertexCount_ = 0;
    faceCount_ = 0;
    vertexDimension_ = 0;

    std::string keyword;
    std::string fileType;
    std::string elementName = "";
    std::string propertyName;
    std::string listIndexType;
    std::string listEntryType;
    float version;

    _is >> keyword;
    _is >> fileType;
    _is >> version;

    if (_is.bad()) {
        omerr() << "Defect PLY header detected" << std::endl;
        return false;
    }

    if (fileType == "ascii") {
        options_ -= Options::Binary;
    } else if (fileType == "binary_little_endian") {
        options_ += Options::Binary;
        options_ += Options::LSB;
        //if (Endian::local() == Endian::MSB)

        //  options_ += Options::Swap;
    } else if (fileType == "binary_big_endian") {
        options_ += Options::Binary;
        options_ += Options::MSB;
        //if (Endian::local() == Endian::LSB)

        //  options_ += Options::Swap;
    } else {
        omerr() << "Unsupported PLY format: " << fileType << std::endl;
        return false;
    }

    std::streamoff streamPos = _is.tellg();
    _is >> keyword;
    while (keyword != "end_header") {

        if (keyword == "comment") {
            std::getline(_is, line);
        } else if (keyword == "element") {
            _is >> elementName;
            if (elementName == "vertex") {
                _is >> vertexCount_;
            } else if (elementName == "face") {
                _is >> faceCount_;
            } else {
                omerr() << "PLY header unsupported element type: " << elementName << std::endl;
            }
        } else if (keyword == "property") {
            std::string tmp1;
            std::string tmp2;

            // Read first keyword, as it might be a list
            _is >> tmp1;

            if (tmp1 == "list") {
                if (elementName == "vertex") {
                    omerr() << "List type not supported for vertices!" << std::endl;
                } else if (elementName == "face") {
                    _is >> listIndexType;
                    _is >> listEntryType;
                    _is >> propertyName;

                    if (listIndexType == "uint8") {
                        faceIndexType_ = ValueTypeUINT8;
                    } else if (listIndexType == "uchar") {
                        faceIndexType_ = ValueTypeUCHAR;
                    } else {
                        omerr() << "Unsupported Index type for face list: " << listIndexType << std::endl;
                        return false;
                    }

                    if (listEntryType == "int32") {
                        faceEntryType_ = ValueTypeINT32;
                    } else if (listEntryType == "int") {
                        faceEntryType_ = ValueTypeINT;
                    } else if (listEntryType == "uint32") {
                        faceEntryType_ = ValueTypeUINT32;
                    } else if (listEntryType == "uint") {
                        faceEntryType_ = ValueTypeUINT;
                    } else {
                        omerr() << "Unsupported Entry type for face list: " << listEntryType << std::endl;
                        return false;
                    }

                }
            } else {
                // as this is not a list property, read second value of property
                _is >> tmp2;

                if (elementName == "vertex") {
                    // Extract name and type of property
                    // As the order seems to be different in some files, autodetect it.
                    ValueType valueType = get_property_type(tmp1, tmp2);
                    propertyName = get_property_name(tmp1, tmp2);

                    if (propertyName == "x") {
                      VertexPropertyInfo entry(XCOORD, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      vertexDimension_++;
                    } else if (propertyName == "y") {
                      VertexPropertyInfo entry(YCOORD, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      vertexDimension_++;
                    } else if (propertyName == "z") {
                      VertexPropertyInfo entry(ZCOORD, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      vertexDimension_++;
                    } else if (propertyName == "nx") {
                      VertexPropertyInfo entry(XNORM, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexNormal;
                    } else if (propertyName == "ny") {
                      VertexPropertyInfo entry(YNORM, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexNormal;
                    } else if (propertyName == "nz") {
                      VertexPropertyInfo entry(ZNORM, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexNormal;
                    } else if (propertyName == "u" || propertyName == "s") {
                      VertexPropertyInfo entry(TEXX, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexTexCoord;
                    } else if (propertyName == "v" || propertyName == "t") {
                      VertexPropertyInfo entry(TEXY, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexTexCoord;
                    } else if (propertyName == "red") {
                      VertexPropertyInfo entry(COLORRED, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "green") {
                      VertexPropertyInfo entry(COLORGREEN, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "blue") {
                      VertexPropertyInfo entry(COLORBLUE, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "diffuse_red") {
                      VertexPropertyInfo entry(COLORRED, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "diffuse_green") {
                      VertexPropertyInfo entry(COLORGREEN, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "diffuse_blue") {
                      VertexPropertyInfo entry(COLORBLUE, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "alpha") {
                      VertexPropertyInfo entry(COLORALPHA, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      options_ += Options::ColorAlpha;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else {
                      VertexProperty prop = (!options_.is_binary()) ? CUSTOM_PROP : UNSUPPORTED; // loading vertex properties is not yet supported by the binary loader
                      if (prop != UNSUPPORTED)
                        options_ += Options::Custom;
                      VertexPropertyInfo entry(prop, valueType, propertyName);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                    }

                    vertexPropertyCount_++;

                } else if (elementName == "face") {
                    omerr() << "Properties not supported for faces " << std::endl;
                }

            }

        } else {
            omlog() << "Unsupported keyword : " << keyword << std::endl;
        }

        streamPos = _is.tellg();
        _is >> keyword;
        if (_is.bad()) {
            omerr() << "Error while reading PLY file header" << std::endl;
            return false;
        }
    }

    // As the binary data is directy after the end_header keyword
    // and the stream removes too many bytes, seek back to the right position
    if (options_.is_binary()) {
        _is.seekg(streamPos + 12);
    }

    return true;
}